

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getFileNameDeletingDirectory(string *path,string *out)

{
  string local_40 [32];
  long local_20;
  size_type bcPos;
  string *out_local;
  string *path_local;
  
  bcPos = (size_type)out;
  out_local = path;
  local_20 = std::__cxx11::string::find_last_of((char)path,0x2f);
  local_20 = local_20 + 1;
  if (local_20 == -1) {
    std::__cxx11::string::operator=((string *)bcPos,(string *)out_local);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)out_local);
    std::__cxx11::string::operator=((string *)bcPos,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void getFileNameDeletingDirectory(const std::string &path, std::string &out)
{
	// パス除去処理
	auto bcPos = path.find_last_of(DIRECTORY_SEPARATOR_CHAR) + 1;
	if (bcPos == std::string::npos) {
		out = path;
	}
	else {
		out = path.substr(bcPos, std::string::npos);
	}
}